

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_0::ShaderTextureFunctionCase::ShaderTextureFunctionCase
          (ShaderTextureFunctionCase *this,TestContext *testCtx,string *name,string *desc,
          TextureLookupSpec *lookup,TextureSpec *texture,TexEvalFunc evalFunc,bool isVertexCase)

{
  IVec3 *this_00;
  TextureSpec *pTVar1;
  bool bVar2;
  bool bVar3;
  Function FVar4;
  CompareMode CVar5;
  TextureType TVar6;
  TextureType TVar7;
  bool bVar8;
  undefined3 uVar9;
  float fVar10;
  byte bVar11;
  DataType DVar12;
  ShaderEvaluator *this_01;
  char *pcVar13;
  char *pcVar14;
  TextureFormat format;
  char *pcVar15;
  char *pcVar16;
  ostream *poVar17;
  ostream *poVar18;
  long lVar19;
  int iVar20;
  uint vecSize;
  ulong uVar21;
  GLSLVersion version;
  TextureSpec *pTVar22;
  int iVar23;
  int iVar24;
  Function FVar25;
  bool *pbVar26;
  ostringstream *this_02;
  bool bVar27;
  DataType local_3a4;
  char *local_3a0;
  char *local_380;
  char *local_358;
  string local_340 [32];
  ostringstream vert;
  ostringstream frag;
  
  bVar11 = 0;
  (this->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderRenderCase_00c003a0;
  this_01 = (ShaderEvaluator *)operator_new(0x20);
  ShaderEvaluator::ShaderEvaluator(this_01);
  this_01->_vptr_ShaderEvaluator = (_func_int **)&PTR__ShaderEvaluator_00c003e8;
  this_01[1]._vptr_ShaderEvaluator = (_func_int **)evalFunc;
  this_01[1].m_evalFunc = (ShaderEvalFunc)&this->m_lookupParams;
  ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,name,desc,isVertexCase,this_01,
             (UniformSetup *)0x0,(AttributeSetupFunc)0x0);
  (this->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderRenderCase_00c003a0;
  (this->m_lookupSpec).function = lookup->function;
  tcu::Vector<float,_4>::Vector(&(this->m_lookupSpec).minCoord,&lookup->minCoord);
  tcu::Vector<float,_4>::Vector(&(this->m_lookupSpec).maxCoord,&lookup->maxCoord);
  (this->m_lookupSpec).maxLodBias = lookup->maxLodBias;
  uVar9 = *(undefined3 *)&lookup->field_0x25;
  fVar10 = lookup->minLodBias;
  (this->m_lookupSpec).useBias = lookup->useBias;
  *(undefined3 *)&(this->m_lookupSpec).field_0x25 = uVar9;
  (this->m_lookupSpec).minLodBias = fVar10;
  tcu::Vector<float,_3>::Vector(&(this->m_lookupSpec).minDX,&lookup->minDX);
  tcu::Vector<float,_3>::Vector(&(this->m_lookupSpec).maxDX,&lookup->maxDX);
  tcu::Vector<float,_3>::Vector(&(this->m_lookupSpec).minDY,&lookup->minDY);
  tcu::Vector<float,_3>::Vector(&(this->m_lookupSpec).maxDY,&lookup->maxDY);
  (this->m_lookupSpec).useOffset = lookup->useOffset;
  this_00 = &(this->m_lookupSpec).offset;
  tcu::Vector<int,_3>::Vector(this_00,&lookup->offset);
  pTVar1 = &this->m_textureSpec;
  pTVar22 = pTVar1;
  for (lVar19 = 0x15; lVar19 != 0; lVar19 = lVar19 + -1) {
    pTVar22->type = texture->type;
    texture = (TextureSpec *)((long)texture + (ulong)bVar11 * -8 + 4);
    pTVar22 = (TextureSpec *)((long)pTVar22 + (ulong)bVar11 * -8 + 4);
  }
  TexLookupParams::TexLookupParams(&this->m_lookupParams);
  FVar4 = (this->m_lookupSpec).function;
  FVar25 = FVar4 & ~FUNCTION_TEXTURELOD;
  CVar5 = (this->m_textureSpec).sampler.compare;
  TVar6 = (this->m_textureSpec).type;
  iVar20 = 1;
  if (TVar6 == TEXTURETYPE_2D && CVar5 == COMPAREMODE_NONE) {
    bVar27 = false;
    iVar23 = (FVar4 == FUNCTION_TEXTUREPROJGRAD || FVar25 == FUNCTION_TEXTUREPROJ) + 1;
  }
  else {
    bVar27 = TVar6 == TEXTURETYPE_1D;
    iVar23 = iVar20;
    if (CVar5 == COMPAREMODE_NONE && TVar6 == TEXTURETYPE_1D) {
      bVar27 = true;
      if (FVar25 == FUNCTION_TEXTUREPROJ) {
        iVar23 = 3;
      }
      else {
        iVar23 = (uint)(FVar4 == FUNCTION_TEXTUREPROJGRAD) * 2 + 1;
      }
    }
  }
  pbVar26 = &(this->m_lookupSpec).useBias;
  if (((TVar6 != TEXTURETYPE_1D) && (iVar20 = 2, TVar6 != TEXTURETYPE_2D)) &&
     (TVar6 != TEXTURETYPE_1D_ARRAY)) {
    iVar20 = (TVar6 == TEXTURETYPE_CUBE_ARRAY) + 3;
  }
  bVar2 = *pbVar26;
  iVar24 = 0;
  if (FVar4 - FUNCTION_TEXTUREPROJGRAD < 3 || FVar25 - FUNCTION_TEXTUREPROJ < 3) {
    iVar24 = iVar23;
  }
  bVar3 = (this->super_ShaderRenderCase).m_isVertexCase;
  iVar23 = bVar27 + 1;
  bVar27 = CVar5 != COMPAREMODE_NONE;
  if (!bVar27) {
    iVar23 = 0;
  }
  iVar24 = iVar23 + iVar20 + iVar24;
  iVar20 = 4;
  if (TVar6 != TEXTURETYPE_CUBE_ARRAY || !bVar27) {
    iVar20 = iVar24;
  }
  DVar12 = glu::getDataTypeFloatVec(iVar20);
  pcVar13 = glu::getDataTypeName(DVar12);
  version = GLSL_VERSION_310_ES;
  pcVar14 = glu::getPrecisionName(PRECISION_HIGHP);
  format = glu::mapGLInternalFormat((this->m_textureSpec).format);
  TVar7 = pTVar1->type;
  if (((ulong)TVar7 < 5) && ((0x1dU >> (TVar7 & 0x1f) & 1) != 0)) {
    DVar12 = *(DataType *)(&DAT_009c0598 + (ulong)TVar7 * 4);
  }
  else {
    DVar12 = TVar7 == TEXTURETYPE_CUBE_ARRAY | TYPE_FLOAT_VEC2;
  }
  pcVar15 = glu::getDataTypeName(DVar12);
  switch(pTVar1->type) {
  case TEXTURETYPE_1D:
    if (CVar5 == COMPAREMODE_NONE) {
      local_3a4 = glu::getSampler1DType(format);
    }
    else {
      local_3a4 = TYPE_SAMPLER_1D_SHADOW;
    }
    break;
  case TEXTURETYPE_2D:
    if (CVar5 == COMPAREMODE_NONE) {
      local_3a4 = glu::getSampler2DType(format);
    }
    else {
      local_3a4 = TYPE_SAMPLER_2D_SHADOW;
    }
    break;
  case TEXTURETYPE_3D:
    local_3a4 = glu::getSampler3DType(format);
    break;
  case TEXTURETYPE_CUBE_MAP:
    if (CVar5 == COMPAREMODE_NONE) {
      local_3a4 = glu::getSamplerCubeType(format);
    }
    else {
      local_3a4 = TYPE_SAMPLER_CUBE_SHADOW;
    }
    break;
  case TEXTURETYPE_1D_ARRAY:
    if (CVar5 == COMPAREMODE_NONE) {
      local_3a4 = glu::getSampler1DArrayType(format);
    }
    else {
      local_3a4 = TYPE_SAMPLER_1D_ARRAY_SHADOW;
    }
    break;
  case TEXTURETYPE_2D_ARRAY:
    if (CVar5 == COMPAREMODE_NONE) {
      local_3a4 = glu::getSampler2DArrayType(format);
    }
    else {
      local_3a4 = TYPE_SAMPLER_2D_ARRAY_SHADOW;
    }
    break;
  case TEXTURETYPE_CUBE_ARRAY:
    if (CVar5 == COMPAREMODE_NONE) {
      local_3a4 = glu::getSamplerCubeArrayType(format);
    }
    else {
      local_3a4 = TYPE_SAMPLER_CUBE_ARRAY_SHADOW;
    }
    break;
  default:
    local_3a4 = TYPE_LAST;
  }
  uVar21 = (ulong)(this->m_lookupSpec).function;
  if (uVar21 < 0xd) {
    local_358 = &DAT_009c05ac + *(int *)(&DAT_009c05ac + uVar21 * 4);
  }
  else {
    local_358 = (char *)0x0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vert);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
  this_02 = (ostringstream *)&frag;
  if (bVar3 != false) {
    this_02 = (ostringstream *)&vert;
  }
  if (pTVar1->type < TEXTURETYPE_LAST) {
    if ((0x2eU >> (pTVar1->type & 0x1f) & 1) == 0) {
      version = GLSL_VERSION_420;
      goto LAB_0061d399;
    }
    bVar8 = true;
  }
  else {
    version = GLSL_VERSION_LAST;
LAB_0061d399:
    bVar8 = false;
  }
  pcVar16 = glu::getGLSLVersionDeclaration(version);
  poVar17 = std::operator<<((ostream *)&vert,pcVar16);
  poVar17 = std::operator<<(poVar17,"\n");
  poVar17 = std::operator<<(poVar17,"layout(location = 0) in highp vec4 a_position;\n");
  poVar17 = std::operator<<(poVar17,"layout(location = 4) in ");
  poVar17 = std::operator<<(poVar17,pcVar14);
  poVar17 = std::operator<<(poVar17," ");
  poVar17 = std::operator<<(poVar17,pcVar13);
  std::operator<<(poVar17," a_in0;\n");
  bVar11 = FVar4 < FUNCTION_LAST & (byte)(0x10f0 >> ((byte)FVar4 & 0x1f));
  FVar25 = FVar4 & ~FUNCTION_TEXTUREPROJ3;
  if (FVar25 == FUNCTION_TEXTUREGRAD) {
    poVar17 = std::operator<<((ostream *)&vert,"layout(location = 5) in ");
    poVar17 = std::operator<<(poVar17,pcVar14);
    poVar17 = std::operator<<(poVar17," ");
    poVar17 = std::operator<<(poVar17,pcVar15);
    std::operator<<(poVar17," a_in1;\n");
    poVar17 = std::operator<<((ostream *)&vert,"layout(location = 6) in ");
    poVar17 = std::operator<<(poVar17,pcVar14);
    poVar17 = std::operator<<(poVar17," ");
    poVar17 = std::operator<<(poVar17,pcVar15);
    pcVar16 = " a_in2;\n";
LAB_0061d502:
    std::operator<<(poVar17,pcVar16);
  }
  else if (bVar11 != 0 || (bVar2 & 1U) != 0) {
    poVar17 = std::operator<<((ostream *)&vert,"layout(location = 5) in ");
    poVar17 = std::operator<<(poVar17,pcVar14);
    pcVar16 = " float a_in1;\n";
    goto LAB_0061d502;
  }
  pcVar16 = glu::getGLSLVersionDeclaration(version);
  poVar17 = (ostream *)&frag;
  poVar18 = std::operator<<(poVar17,pcVar16);
  poVar18 = std::operator<<(poVar18,"\n");
  std::operator<<(poVar18,"layout(location = 0) out mediump vec4 o_color;\n");
  if (bVar3 == false) {
    poVar17 = std::operator<<((ostream *)&vert,"layout(location = 0) out ");
    poVar17 = std::operator<<(poVar17,pcVar14);
    poVar17 = std::operator<<(poVar17," ");
    poVar17 = std::operator<<(poVar17,pcVar13);
    std::operator<<(poVar17," v_texCoord;\n");
    poVar17 = std::operator<<((ostream *)&frag,"layout(location = 0) in ");
    poVar17 = std::operator<<(poVar17,pcVar14);
    poVar17 = std::operator<<(poVar17," ");
    poVar17 = std::operator<<(poVar17,pcVar13);
    std::operator<<(poVar17," v_texCoord;\n");
    if (FVar25 == FUNCTION_TEXTUREGRAD) {
      poVar17 = std::operator<<((ostream *)&vert,"layout(location = 1) out ");
      poVar17 = std::operator<<(poVar17,pcVar14);
      poVar17 = std::operator<<(poVar17," ");
      poVar17 = std::operator<<(poVar17,pcVar15);
      std::operator<<(poVar17," v_gradX;\n");
      poVar17 = std::operator<<((ostream *)&vert,"layout(location = 2) out ");
      poVar17 = std::operator<<(poVar17,pcVar14);
      poVar17 = std::operator<<(poVar17," ");
      poVar17 = std::operator<<(poVar17,pcVar15);
      pcVar13 = " v_gradY;\n";
      std::operator<<(poVar17," v_gradY;\n");
      poVar17 = std::operator<<((ostream *)&frag,"layout(location = 1) in ");
      poVar17 = std::operator<<(poVar17,pcVar14);
      poVar17 = std::operator<<(poVar17," ");
      poVar17 = std::operator<<(poVar17,pcVar15);
      std::operator<<(poVar17," v_gradX;\n");
      poVar17 = std::operator<<((ostream *)&frag,"layout(location = 2) in ");
      poVar17 = std::operator<<(poVar17,pcVar14);
      poVar17 = std::operator<<(poVar17," ");
      poVar17 = std::operator<<(poVar17,pcVar15);
      goto LAB_0061d791;
    }
    if (bVar11 != 0 || (bVar2 & 1U) != 0) {
      poVar17 = std::operator<<((ostream *)&vert,"layout(location = 1) out ");
      poVar17 = std::operator<<(poVar17,pcVar14);
      pcVar13 = " float v_lodBias;\n";
      std::operator<<(poVar17," float v_lodBias;\n");
      poVar17 = std::operator<<((ostream *)&frag,"layout(location = 1) in ");
      poVar17 = std::operator<<(poVar17,pcVar14);
      goto LAB_0061d791;
    }
  }
  else {
    std::operator<<((ostream *)&vert,"layout(location = 0) out mediump vec4 v_color;\n");
    pcVar13 = "layout(location = 0) in mediump vec4 v_color;\n";
LAB_0061d791:
    std::operator<<(poVar17,pcVar13);
  }
  poVar17 = std::operator<<((ostream *)this_02,"layout(set = 0, binding = 0) uniform highp ");
  pcVar13 = glu::getDataTypeName(local_3a4);
  poVar17 = std::operator<<(poVar17,pcVar13);
  poVar17 = std::operator<<(poVar17," u_sampler;\n");
  poVar17 = std::operator<<(poVar17,
                            "layout(set = 0, binding = 1) uniform buf0 { highp vec4 u_scale; };\n");
  std::operator<<(poVar17,"layout(set = 0, binding = 2) uniform buf1 { highp vec4 u_bias; };\n");
  if (!bVar8) {
    poVar17 = std::operator<<((ostream *)&vert,"out gl_PerVertex {\n");
    poVar17 = std::operator<<(poVar17,"\tvec4 gl_Position;\n");
    std::operator<<(poVar17,"};\n");
  }
  poVar17 = std::operator<<((ostream *)&vert,"\nvoid main()\n{\n");
  std::operator<<(poVar17,"\tgl_Position = a_position;\n");
  poVar17 = (ostream *)&frag;
  std::operator<<(poVar17,"\nvoid main()\n{\n");
  if (bVar3 == false) {
    std::operator<<((ostream *)&frag,"\to_color = ");
    local_3a0 = "v_texCoord";
    pcVar14 = "v_gradX";
    pcVar13 = "v_gradY";
    local_380 = "v_lodBias";
  }
  else {
    std::operator<<((ostream *)&vert,"\tv_color = ");
    local_3a0 = "a_in0";
    pcVar13 = "a_in2";
    pcVar14 = "a_in1";
    local_380 = "a_in1";
  }
  poVar18 = std::operator<<((ostream *)this_02,"vec4(");
  std::operator<<(poVar18,local_358);
  if ((this->m_lookupSpec).useOffset == true) {
    std::operator<<((ostream *)this_02,"Offset");
  }
  std::operator<<((ostream *)this_02,"(u_sampler, ");
  if (FVar4 == FUNCTION_TEXELFETCH) {
    DVar12 = glu::getDataTypeIntVec(iVar24);
    pcVar15 = glu::getDataTypeName(DVar12);
    poVar18 = std::operator<<((ostream *)this_02,pcVar15);
    std::operator<<(poVar18,"(");
  }
  std::operator<<((ostream *)this_02,local_3a0);
  if (FVar4 == FUNCTION_TEXELFETCH) {
    std::operator<<((ostream *)this_02,")");
    poVar18 = std::operator<<((ostream *)this_02,", int(");
    poVar18 = std::operator<<(poVar18,local_380);
    pcVar13 = ")";
LAB_0061d9e3:
    std::operator<<(poVar18,pcVar13);
  }
  else {
    if (FVar25 == FUNCTION_TEXTUREGRAD) {
      poVar18 = std::operator<<((ostream *)this_02,", ");
      poVar18 = std::operator<<(poVar18,pcVar14);
      poVar18 = std::operator<<(poVar18,", ");
      goto LAB_0061d9e3;
    }
    if (FVar25 == FUNCTION_TEXTURELOD) {
      poVar18 = std::operator<<((ostream *)this_02,", ");
      pcVar13 = local_380;
      goto LAB_0061d9e3;
    }
  }
  if ((this->m_lookupSpec).useOffset == true) {
    if ((pTVar1->type & ~TEXTURETYPE_1D_ARRAY) == TEXTURETYPE_1D) {
      vecSize = 1;
    }
    else {
      vecSize = pTVar1->type == TEXTURETYPE_3D | 2;
    }
    poVar18 = std::operator<<((ostream *)this_02,", ");
    DVar12 = glu::getDataTypeIntVec(vecSize);
    pcVar13 = glu::getDataTypeName(DVar12);
    poVar18 = std::operator<<(poVar18,pcVar13);
    std::operator<<(poVar18,"(");
    for (uVar21 = 0; vecSize != uVar21; uVar21 = uVar21 + 1) {
      if (uVar21 != 0) {
        std::operator<<((ostream *)this_02,", ");
      }
      std::ostream::operator<<(this_02,this_00->m_data[uVar21]);
    }
    std::operator<<((ostream *)this_02,")");
  }
  if ((TVar6 == TEXTURETYPE_CUBE_ARRAY && bVar27) &&
      (this->m_lookupSpec).function == FUNCTION_TEXTURE) {
    poVar18 = std::operator<<((ostream *)this_02,", ");
    poVar18 = std::operator<<(poVar18,local_3a0);
    std::operator<<(poVar18,".w");
  }
  if (*pbVar26 == true) {
    poVar18 = std::operator<<((ostream *)this_02,", ");
    std::operator<<(poVar18,local_380);
  }
  std::operator<<((ostream *)this_02,")");
  pcVar13 = ", 0.0, 0.0, 1.0)";
  if (CVar5 == COMPAREMODE_NONE) {
    pcVar13 = ")*u_scale + u_bias";
  }
  std::operator<<((ostream *)this_02,pcVar13);
  std::operator<<((ostream *)this_02,";\n");
  if (bVar3 == false) {
    poVar17 = (ostream *)&vert;
    std::operator<<(poVar17,"\tv_texCoord = a_in0;\n");
    if (FVar25 == FUNCTION_TEXTUREGRAD) {
      poVar17 = (ostream *)&vert;
      std::operator<<(poVar17,"\tv_gradX = a_in1;\n");
      pcVar13 = "\tv_gradY = a_in2;\n";
    }
    else {
      if (bVar11 == 0 && (bVar2 & 1U) == 0) goto LAB_0061dba5;
      pcVar13 = "\tv_lodBias = a_in1;\n";
    }
  }
  else {
    pcVar13 = "\to_color = v_color;\n";
  }
  std::operator<<(poVar17,pcVar13);
LAB_0061dba5:
  std::operator<<((ostream *)&vert,"}\n");
  std::operator<<((ostream *)&frag,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,local_340);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,local_340);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vert);
  return;
}

Assistant:

ShaderTextureFunctionCase::ShaderTextureFunctionCase (tcu::TestContext&				testCtx,
													  const std::string&			name,
													  const std::string&			desc,
													  const TextureLookupSpec&		lookup,
													  const TextureSpec&			texture,
													  TexEvalFunc					evalFunc,
													  bool							isVertexCase)
	: ShaderRenderCase		(testCtx, name, desc, isVertexCase, new TexLookupEvaluator(evalFunc, m_lookupParams), NULL, NULL)
	, m_lookupSpec			(lookup)
	, m_textureSpec			(texture)
{
	initShaderSources();
}